

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringNew *curr)

{
  Name breakTo;
  bool bVar1;
  element_type *peVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer pLVar5;
  Literal *x;
  shared_ptr<wasm::GCData> local_1a0;
  Literal local_190;
  undefined1 local_178 [8];
  HeapType heapType;
  size_t i;
  Literals contents;
  size_t endVal;
  size_t startVal;
  Literals *ptrDataValues;
  shared_ptr<wasm::GCData> ptrData;
  Flow end;
  Flow start;
  undefined1 local_68 [8];
  Flow ptr;
  StringNew *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ptr.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,*(Expression **)(curr + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else if (*(int *)(ptr.breakTo.super_IString.str._M_str + 0x10) == 7) {
    visit((Flow *)&end.breakTo.super_IString.str._M_str,this,
          *(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&end.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&end.breakTo.super_IString.str._M_str);
    }
    else {
      visit((Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,this,*(Expression **)(ptr.breakTo.super_IString.str._M_str + 0x30))
      ;
      bVar1 = Flow::breaking((Flow *)&ptrData.
                                      super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,
                   (Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
      }
      else {
        Flow::getSingleValue((Flow *)local_68);
        ::wasm::Literal::getGCData();
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&ptrDataValues);
        if (!bVar1) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        peVar2 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&ptrDataValues);
        Flow::getSingleValue((Flow *)&end.breakTo.super_IString.str._M_str);
        pLVar3 = (pointer)::wasm::Literal::getUnsigned();
        Flow::getSingleValue
                  ((Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        pLVar4 = (pointer)::wasm::Literal::getUnsigned();
        contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pLVar4;
        pLVar5 = (pointer)SmallVector<wasm::Literal,_1UL>::size
                                    (&(peVar2->values).super_SmallVector<wasm::Literal,_1UL>);
        if (pLVar5 < pLVar4) {
          (*this->_vptr_ExpressionRunner[2])(this,"array oob");
        }
        Literals::Literals((Literals *)&i);
        if (pLVar3 < contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) {
          SmallVector<wasm::Literal,_1UL>::reserve
                    ((SmallVector<wasm::Literal,_1UL> *)&i,
                     (long)contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage - (long)pLVar3);
          for (heapType.id = (uintptr_t)pLVar3;
              heapType.id <
              contents.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage; heapType.id = heapType.id + 1) {
            x = SmallVector<wasm::Literal,_1UL>::operator[]
                          (&(peVar2->values).super_SmallVector<wasm::Literal,_1UL>,heapType.id);
            SmallVector<wasm::Literal,_1UL>::push_back((SmallVector<wasm::Literal,_1UL> *)&i,x);
          }
        }
        local_178 = (undefined1  [8])::wasm::Type::getHeapType();
        std::make_shared<wasm::GCData,wasm::HeapType&,wasm::Literals&>
                  ((HeapType *)&local_1a0,(Literals *)local_178);
        ::wasm::Literal::Literal(&local_190,&local_1a0,local_178);
        Flow::Flow(__return_storage_ptr__,&local_190);
        ::wasm::Literal::~Literal(&local_190);
        std::shared_ptr<wasm::GCData>::~shared_ptr(&local_1a0);
        Literals::~Literals((Literals *)&i);
        std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&ptrDataValues);
      }
      Flow::~Flow((Flow *)&ptrData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
    Flow::~Flow((Flow *)&end.breakTo.super_IString.str._M_str);
  }
  else {
    breakTo.super_IString.str._M_str = _visitArrayNewSeg;
    breakTo.super_IString.str._M_len = NONCONSTANT_FLOW;
    Flow::Flow(__return_storage_ptr__,breakTo);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringNew(StringNew* curr) {
    Flow ptr = visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    switch (curr->op) {
      case StringNewWTF16Array: {
        Flow start = visit(curr->start);
        if (start.breaking()) {
          return start;
        }
        Flow end = visit(curr->end);
        if (end.breaking()) {
          return end;
        }
        auto ptrData = ptr.getSingleValue().getGCData();
        if (!ptrData) {
          trap("null ref");
        }
        const auto& ptrDataValues = ptrData->values;
        size_t startVal = start.getSingleValue().getUnsigned();
        size_t endVal = end.getSingleValue().getUnsigned();
        if (endVal > ptrDataValues.size()) {
          trap("array oob");
        }
        Literals contents;
        if (endVal > startVal) {
          contents.reserve(endVal - startVal);
          for (size_t i = startVal; i < endVal; i++) {
            contents.push_back(ptrDataValues[i]);
          }
        }
        auto heapType = curr->type.getHeapType();
        return Literal(std::make_shared<GCData>(heapType, contents), heapType);
      }
      default:
        // TODO: others
        return Flow(NONCONSTANT_FLOW);
    }
  }